

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O0

Var Js::JavascriptExternalFunction::HandleRecordReplayExternalFunction_Thunk
              (JavascriptFunction *function,CallInfo *callInfo,Arguments *args,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  TTDNestingDepthAutoAdjuster this;
  bool bVar2;
  ThreadContext *pTVar3;
  EventLogEntry *evt;
  undefined4 *puVar4;
  undefined1 local_a8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  EventLogEntry *callEvent;
  TTDNestingDepthAutoAdjuster logPopper_1;
  EventLog *elog;
  TTDNestingDepthAutoAdjuster local_40;
  TTDNestingDepthAutoAdjuster logPopper;
  Var result;
  JavascriptExternalFunction *externalFunction;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  CallInfo *callInfo_local;
  JavascriptFunction *function_local;
  
  logPopper.m_threadContext = (ThreadContext *)0x0;
  bVar2 = ScriptContext::ShouldPerformReplayAction(scriptContext);
  if (bVar2) {
    pTVar3 = ScriptContext::GetThreadContext(scriptContext);
    TTD::TTDNestingDepthAutoAdjuster::TTDNestingDepthAutoAdjuster(&local_40,pTVar3);
    pTVar3 = ScriptContext::GetThreadContext(scriptContext);
    TTD::EventLog::ReplayExternalCallEvent(pTVar3->TTDLog,function,args,&logPopper.m_threadContext);
    TTD::TTDNestingDepthAutoAdjuster::~TTDNestingDepthAutoAdjuster(&local_40);
  }
  else {
    bVar2 = ScriptContext::ShouldPerformRecordAction(scriptContext);
    if (!bVar2) {
      TTDAbort_unrecoverable_error("Check either record/replay before calling!!!");
    }
    pTVar3 = ScriptContext::GetThreadContext(scriptContext);
    logPopper_1.m_threadContext = (ThreadContext *)pTVar3->TTDLog;
    pTVar3 = ScriptContext::GetThreadContext(scriptContext);
    TTD::TTDNestingDepthAutoAdjuster::TTDNestingDepthAutoAdjuster
              ((TTDNestingDepthAutoAdjuster *)&callEvent,pTVar3);
    this = logPopper_1;
    pTVar3 = ScriptContext::GetThreadContext(scriptContext);
    evt = TTD::EventLog::RecordExternalCallEvent
                    ((EventLog *)this.m_threadContext,function,pTVar3->TTDRootNestingCount,args,
                     false);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,scriptContext,&function_local);
    pTVar3 = ScriptContext::GetThreadContext(scriptContext);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_a8,pTVar3);
    logPopper.m_threadContext =
         (ThreadContext *)(*(code *)function[1].functionInfo.ptr)(function,*callInfo,args->Values);
    bVar2 = ScriptContext::HasRecordedException(scriptContext);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                  ,0x18e,"(!scriptContext->HasRecordedException())",
                                  "!scriptContext->HasRecordedException()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (scriptContext != (ScriptContext *)0x0) {
      pTVar3 = ScriptContext::GetThreadContext(scriptContext);
      ThreadContext::DisposeOnLeaveScript(pTVar3);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_a8);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
    TTD::EventLog::RecordExternalCallEvent_Complete
              ((EventLog *)logPopper_1.m_threadContext,function,evt,logPopper.m_threadContext);
    TTD::TTDNestingDepthAutoAdjuster::~TTDNestingDepthAutoAdjuster
              ((TTDNestingDepthAutoAdjuster *)&callEvent);
  }
  return logPopper.m_threadContext;
}

Assistant:

Var JavascriptExternalFunction::HandleRecordReplayExternalFunction_Thunk(Js::JavascriptFunction* function, CallInfo& callInfo, Arguments& args, ScriptContext* scriptContext)
    {
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);

        Var result = nullptr;

        if(scriptContext->ShouldPerformReplayAction())
        {
            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            scriptContext->GetThreadContext()->TTDLog->ReplayExternalCallEvent(externalFunction, args, &result);
        }
        else
        {
            TTDAssert(scriptContext->ShouldPerformRecordAction(), "Check either record/replay before calling!!!");

            TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;

            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            TTD::NSLogEvents::EventLogEntry* callEvent = elog->RecordExternalCallEvent(externalFunction, scriptContext->GetThreadContext()->TTDRootNestingCount, args, false);

            BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext)
            {
                // Don't do stack probe since BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION does that for us already
                result = externalFunction->nativeMethod(function, callInfo, args.Values);
            }
            END_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext);

            //Exceptions should be prohibited so no need to do extra work
            elog->RecordExternalCallEvent_Complete(externalFunction, callEvent, result);
        }

        return result;
    }